

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::readent(entity *e,char *buf,int ver)

{
  short sVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  if (ver < 0x1f) {
    bVar2 = e->type;
    if ((bVar2 - 0x19 < 6) || (bVar2 - 0x14 < 2)) {
      sVar1 = e->attr1;
      iVar5 = (int)((ulong)((long)(sVar1 + 0xb4) * -0x49f49f49) >> 0x20) + (int)sVar1 + 0xb4;
      e->attr1 = sVar1 + ((short)((uint)iVar5 >> 8) - (short)(iVar5 >> 0x1f)) * -0x168 + 0xb4;
    }
  }
  else {
    if (ver != 0x1f) {
      return;
    }
    bVar2 = e->type;
  }
  if ((byte)(bVar2 - 0x1a) < 4) {
    uVar3 = (uint)(ushort)e->attr1 + ((int)e->attr1 / 0x168) * -0x168;
    uVar4 = uVar3 + 0x168 & 0xffff;
    uVar6 = uVar4 - 0x168;
    if (0xfe97 < (uVar3 & 0xffff)) {
      uVar6 = uVar4;
    }
    e->attr1 = (short)((uVar6 + 7) / 0xf) * 0xf;
  }
  return;
}

Assistant:

void readent(entity &e, char *buf, int ver) //read from disk, and init
    {
        if(ver <= 30) switch(e.type)
        {
            case FLAG:
            case MONSTER:
            case TELEDEST:
            case RESPAWNPOINT:
            case BOX:
            case BARREL:
            case PLATFORM:
            case ELEVATOR:
                e.attr1 = (int(e.attr1)+180)%360;
                break;
        }
        if(ver <= 31) switch(e.type)
        {
            case BOX:
            case BARREL:
            case PLATFORM:
            case ELEVATOR:
                int yaw = (int(e.attr1)%360 + 360)%360 + 7;
                e.attr1 = yaw - yaw%15;
                break;
        }
    }